

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void UnRegisterModule(nodecontext *p,nodemodule *Module,bool_t IncludingModule)

{
  thisnode p_00;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  nodeclass *Class;
  node *Node;
  
  uVar1 = (p->NodeSingleton)._Used;
  if (7 < uVar1) {
    pcVar2 = (p->NodeSingleton)._Begin;
    pcVar3 = pcVar2;
    do {
      p_00 = *(thisnode *)pcVar3;
      if (*(nodemodule **)(*(long *)((long)p_00 + 8) + -0x38) == Module) {
        ArrayDelete(&p->NodeSingleton,(long)pcVar3 - (long)pcVar2,8);
        Node_Release(p_00);
        pcVar2 = (p->NodeSingleton)._Begin;
        uVar1 = (p->NodeSingleton)._Used;
        pcVar3 = pcVar2 + -8;
      }
      pcVar3 = pcVar3 + 8;
    } while (pcVar3 != pcVar2 + (uVar1 & 0xfffffffffffffff8));
  }
  if (((nodecontext *)Module != p) && ((Module->Base).RefCount != 1)) {
    __assert_fail("Module==&p->Base || Module->Base.RefCount==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x188,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
  }
  uVar1 = (p->NodeClass)._Used;
  if (7 < uVar1) {
    pcVar3 = (p->NodeClass)._Begin;
    pcVar2 = pcVar3;
    do {
      Class = *(nodeclass **)pcVar2;
      if ((Class->Meta != (nodemeta *)0x0) && (Class->Module == Module)) {
        if ('\0' < Class->State) {
          UnInitClass(p,Class,IncludingModule);
          Class = *(nodeclass **)pcVar2;
          pcVar3 = (p->NodeClass)._Begin;
          uVar1 = (p->NodeClass)._Used;
        }
        Class->Meta = (nodemeta *)0x0;
      }
      pcVar2 = pcVar2 + 8;
    } while (pcVar2 != pcVar3 + (uVar1 & 0xfffffffffffffff8));
  }
  return;
}

Assistant:

static void UnRegisterModule(nodecontext* p, nodemodule* Module, bool_t IncludingModule)
{
    nodeclass** i;
    node** j;

    // release singleton objects
    for (j=ARRAYBEGIN(p->NodeSingleton,node*);j!=ARRAYEND(p->NodeSingleton,node*);++j)
    {
        if (NodeGetClass(*j)->Module == Module)
        {
            node* Node = *j;
            ArrayDelete(&p->NodeSingleton,(uint8_t*)j-ARRAYBEGIN(p->NodeSingleton,uint8_t),sizeof(node*));
            Node_Release(Node);
            j = ARRAYBEGIN(p->NodeSingleton,node*)-1;
        }
    }

    // node memory leak in this module? (root module checked in NodeContext_Done)
    assert(Module==&p->Base || Module->Base.RefCount==1);

    for (i=ARRAYBEGIN(p->NodeClass,nodeclass*);i!=ARRAYEND(p->NodeClass,nodeclass*);++i)
        if ((*i)->Meta && (*i)->Module == Module)
        {
            if ((*i)->State>=CLASS_INITED)
                UnInitClass(p,(*i),IncludingModule);
            (*i)->Meta = NULL;
        }
}